

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_dropout.cpp
# Opt level: O3

int test_dropout(Mat *a,float scale)

{
  int *piVar1;
  void *__ptr;
  long *plVar2;
  int iVar3;
  long lVar4;
  Option opt;
  ParamDict pd;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> local_958;
  Option local_938;
  ParamDict local_910;
  
  ncnn::ParamDict::ParamDict(&local_910);
  ncnn::ParamDict::set(&local_910,0,scale);
  local_958.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_958.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_958.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ncnn::Option::Option(&local_938);
  local_938.num_threads = 1;
  local_938.use_int8_inference = false;
  local_938.use_vulkan_compute = true;
  iVar3 = test_layer<ncnn::Dropout>
                    ("Dropout",&local_910,&local_958,&local_938,a,0.001,
                     (_func_void_Dropout_ptr *)0x0);
  if (iVar3 != 0) {
    test_dropout();
  }
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&local_958);
  lVar4 = 0x8c0;
  do {
    piVar1 = *(int **)((long)&local_910.params[0].v.data + lVar4);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        __ptr = *(void **)((long)&local_910.params[0].type + lVar4);
        plVar2 = *(long **)((long)&local_910.params[0].v.elempack + lVar4);
        if (plVar2 == (long *)0x0) {
          if (__ptr != (void *)0x0) {
            free(__ptr);
          }
        }
        else {
          (**(code **)(*plVar2 + 0x18))();
        }
      }
    }
    *(undefined8 *)((long)&local_910.params[0].v.data + lVar4 + 4) = 0;
    *(undefined8 *)((long)&local_910.params[0].v.refcount + lVar4 + 4) = 0;
    *(undefined8 *)((long)&local_910.params[0].type + lVar4) = 0;
    *(undefined8 *)((long)&local_910.params[0].v.data + lVar4) = 0;
    *(undefined8 *)((long)&local_910.params[0].v.allocator + lVar4) = 0;
    *(undefined8 *)((long)&local_910.params[0].v.dims + lVar4) = 0;
    *(undefined8 *)((long)&local_910.params[0].v.h + lVar4) = 0;
    lVar4 = lVar4 + -0x48;
  } while (lVar4 != -0x40);
  return iVar3;
}

Assistant:

static int test_dropout(const ncnn::Mat& a, float scale)
{
    ncnn::ParamDict pd;
    pd.set(0, scale);

    std::vector<ncnn::Mat> weights(0);

    ncnn::Option opt;
    opt.num_threads = 1;
    opt.use_vulkan_compute = true;
    opt.use_int8_inference = false;

    int ret = test_layer<ncnn::Dropout>("Dropout", pd, weights, opt, a);
    if (ret != 0)
    {
        fprintf(stderr, "test_dropout failed a.dims=%d a=(%d %d %d) scale=%f\n", a.dims, a.w, a.h, a.c, scale);
    }

    return ret;
}